

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::PathPtr::append(Path *__return_storage_ptr__,PathPtr *this,PathPtr suffix)

{
  String *value;
  long lVar1;
  String *p;
  size_t count;
  String *pSVar2;
  String *__begin1;
  Array<char> local_88;
  ArrayBuilder<kj::String> newParts;
  Array<kj::String> local_48;
  
  value = suffix.parts.ptr;
  count = (this->parts).size_ + suffix.parts.size_;
  newParts.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  newParts.endPtr = newParts.ptr + count;
  newParts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar2 = (this->parts).ptr;
  newParts.pos = newParts.ptr;
  for (lVar1 = (this->parts).size_ * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    heapString((String *)&local_88,pSVar2);
    ((newParts.pos)->content).ptr = local_88.ptr;
    ((newParts.pos)->content).size_ = local_88.size_;
    ((newParts.pos)->content).disposer = local_88.disposer;
    local_88.ptr = (char *)0x0;
    local_88.size_ = 0;
    newParts.pos = newParts.pos + 1;
    Array<char>::~Array(&local_88);
    pSVar2 = pSVar2 + 1;
  }
  for (lVar1 = suffix.parts.size_ * 0x18; pSVar2 = newParts.ptr, lVar1 != 0; lVar1 = lVar1 + -0x18)
  {
    heapString((String *)&local_88,value);
    ((newParts.pos)->content).ptr = local_88.ptr;
    ((newParts.pos)->content).size_ = local_88.size_;
    ((newParts.pos)->content).disposer = local_88.disposer;
    local_88.ptr = (char *)0x0;
    local_88.size_ = 0;
    newParts.pos = newParts.pos + 1;
    Array<char>::~Array(&local_88);
    value = value + 1;
  }
  lVar1 = (long)newParts.pos - (long)newParts.ptr;
  local_48.disposer = newParts.disposer;
  newParts.ptr = (String *)0x0;
  newParts.pos = (RemoveConst<kj::String> *)0x0;
  newParts.endPtr = (String *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar2;
  (__return_storage_ptr__->parts).size_ = lVar1 / 0x18;
  (__return_storage_ptr__->parts).disposer = newParts.disposer;
  local_48.ptr = (String *)0x0;
  local_48.size_ = 0;
  Array<kj::String>::~Array(&local_48);
  ArrayBuilder<kj::String>::dispose(&newParts);
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::append(PathPtr suffix) const {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(heapString(p));
  for (auto& p: suffix.parts) newParts.add(heapString(p));
  return Path(newParts.finish(), Path::ALREADY_CHECKED);
}